

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runsuite.c
# Opt level: O3

void installResources(xmlNodePtr tst,xmlChar *base)

{
  int iVar1;
  long lVar2;
  xmlNodePtr pxVar3;
  xmlChar *pxVar4;
  undefined8 uVar5;
  char *pcVar6;
  xmlChar *pxVar7;
  long lVar8;
  undefined8 *in_R9;
  
  pxVar4 = base;
  lVar2 = xmlBufferCreate();
  if (lVar2 != 0) {
    xmlBufferSetAllocationScheme(lVar2,0);
    xmlNodeDump(lVar2,tst->doc,tst,0,0);
    do {
      pxVar3 = getNext(tst,"./*");
      if (pxVar3 != (xmlNodePtr)0x0) {
        xmlBufferEmpty(lVar2);
        xmlNodeDump(lVar2,pxVar3->doc,pxVar3,0,0);
        pxVar4 = getString(tst,"string(@name)");
        uVar5 = xmlBufferContent(lVar2);
        pcVar6 = (char *)xmlStrdup(uVar5);
        if (pcVar6 == (char *)0x0 || pxVar4 == (xmlChar *)0x0) {
          if (pxVar4 != (xmlChar *)0x0) {
            (*_xmlFree)(pxVar4);
          }
          if (pcVar6 != (char *)0x0) {
            (*_xmlFree)(pcVar6);
          }
        }
        else {
          pxVar7 = composeDir(base,pxVar4);
          (*_xmlFree)(pxVar4);
          lVar8 = (long)nb_entities;
          if (lVar8 < 0x14) {
            testEntitiesName[lVar8] = (char *)pxVar7;
            testEntitiesValue[lVar8] = pcVar6;
            nb_entities = nb_entities + 1;
          }
          else {
            installResources_cold_1();
          }
        }
      }
      tst = getNext(tst,"following-sibling::resource[1]");
    } while (tst != (xmlNodePtr)0x0);
    xmlBufferFree(lVar2);
    return;
  }
  installResources_cold_2();
  lVar2 = (long)nb_entities;
  if (0 < lVar2) {
    lVar8 = 0;
    do {
      pcVar6 = *(char **)((long)testEntitiesName + lVar8);
      iVar1 = strcmp(pcVar6,(char *)pxVar4);
      if (iVar1 == 0) {
        uVar5 = xmlNewInputFromString(pcVar6,*(undefined8 *)((long)testEntitiesValue + lVar8),2);
        *in_R9 = uVar5;
        return;
      }
      lVar8 = lVar8 + 8;
    } while (lVar2 * 8 != lVar8);
  }
  xmlNewInputFromUrl(pxVar4,0,in_R9);
  return;
}

Assistant:

static void
installResources(xmlNodePtr tst, const xmlChar *base) {
    xmlNodePtr test;
    xmlBufferPtr buf;
    xmlChar *name, *content, *res;

    buf = xmlBufferCreate();
    if (buf == NULL) {
        fprintf(stderr, "out of memory !\n");
	fatalError();
    }
    xmlBufferSetAllocationScheme(buf, XML_BUFFER_ALLOC_DOUBLEIT);
    xmlNodeDump(buf, tst->doc, tst, 0, 0);

    while (tst != NULL) {
	test = getNext(tst, "./*");
	if (test != NULL) {
	    xmlBufferEmpty(buf);
	    xmlNodeDump(buf, test->doc, test, 0, 0);
	    name = getString(tst, "string(@name)");
	    content = xmlStrdup(xmlBufferContent(buf));
	    if ((name != NULL) && (content != NULL)) {
	        res = composeDir(base, name);
		xmlFree(name);
	        addEntity((char *) res, (char *) content);
	    } else {
	        if (name != NULL) xmlFree(name);
	        if (content != NULL) xmlFree(content);
	    }
	}
	tst = getNext(tst, "following-sibling::resource[1]");
    }
    if (buf != NULL)
	xmlBufferFree(buf);
}